

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O2

bool __thiscall fizplex::LP::is_feasible(LP *this,DVector *x)

{
  double dVar1;
  bool bVar2;
  size_t *psVar3;
  double *pdVar4;
  Debug *pDVar5;
  pointer pCVar6;
  pointer pCVar7;
  bool bVar8;
  size_t row;
  size_t col;
  long lVar9;
  ulong column;
  size_t i;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  Debug local_58;
  undefined1 local_48 [16];
  double local_38;
  
  psVar3 = DVector::dimension(x);
  pCVar7 = (this->cols).
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar6 = (this->cols).
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (*psVar3 == ((long)pCVar6 - (long)pCVar7) / 0x18) {
    bVar8 = true;
    lVar9 = 0;
    for (uVar10 = 0; uVar10 < (ulong)(((long)pCVar6 - (long)pCVar7) / 0x18); uVar10 = uVar10 + 1) {
      if ((*(ulong *)((long)&pCVar7->lower + lVar9) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
        pdVar4 = DVector::operator[](x,uVar10);
        bVar2 = is_lower_norm(*pdVar4,*(double *)
                                       ((long)&((this->cols).
                                                super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->lower +
                                       lVar9));
        if (bVar2) {
          local_58.out = (ostream *)&std::cerr;
          local_58.print = false;
          pDVar5 = Debug::operator<<(&local_58,"Var ");
          pDVar5 = Debug::operator<<(pDVar5,uVar10);
          pDVar5 = Debug::operator<<(pDVar5," is below lower bound: ");
          pdVar4 = DVector::operator[](x,uVar10);
          pDVar5 = Debug::operator<<(pDVar5,*pdVar4);
          pDVar5 = Debug::operator<<(pDVar5," < ");
          pDVar5 = Debug::operator<<(pDVar5,*(double *)
                                             ((long)&((this->cols).
                                                                                                            
                                                  super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->lower
                                             + lVar9));
          Debug::operator<<(pDVar5,"\n");
          bVar8 = false;
        }
      }
      if ((*(ulong *)((long)&((this->cols).
                              super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                              ._M_impl.super__Vector_impl_data._M_start)->upper + lVar9) &
          0x7fffffffffffffff) < 0x7ff0000000000000) {
        pdVar4 = DVector::operator[](x,uVar10);
        bVar2 = is_greater_norm(*pdVar4,*(double *)
                                         ((long)&((this->cols).
                                                  super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->upper
                                         + lVar9));
        if (bVar2) {
          local_58.out = (ostream *)&std::cerr;
          local_58.print = false;
          pDVar5 = Debug::operator<<(&local_58,"Var ");
          pDVar5 = Debug::operator<<(pDVar5,uVar10);
          pDVar5 = Debug::operator<<(pDVar5," is above upper bound: ");
          pdVar4 = DVector::operator[](x,uVar10);
          pDVar5 = Debug::operator<<(pDVar5,*pdVar4);
          pDVar5 = Debug::operator<<(pDVar5," > ");
          pDVar5 = Debug::operator<<(pDVar5,*(double *)
                                             ((long)&((this->cols).
                                                                                                            
                                                  super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->upper
                                             + lVar9));
          Debug::operator<<(pDVar5,"\n");
          bVar8 = false;
        }
      }
      pCVar7 = (this->cols).
               super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl
               .super__Vector_impl_data._M_start;
      pCVar6 = (this->cols).
               super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl
               .super__Vector_impl_data._M_finish;
      lVar9 = lVar9 + 0x18;
    }
    for (uVar10 = 0;
        uVar10 < (ulong)(((long)(this->rows).
                                super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->rows).
                               super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar10 = uVar10 + 1) {
      dVar1 = 0.0;
      uVar11 = 0;
      uVar12 = 0;
      for (column = 0; local_48._8_4_ = uVar11, local_48._0_8_ = dVar1, local_48._12_4_ = uVar12,
          column < (ulong)(((long)(this->cols).
                                  super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->cols).
                                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          column = column + 1) {
        local_38 = ColMatrix::get_value(&this->A,uVar10,column);
        pdVar4 = DVector::operator[](x,column);
        uVar11 = local_48._8_4_;
        uVar12 = local_48._12_4_;
        dVar1 = local_48._0_8_ + local_38 * *pdVar4;
      }
      pdVar4 = DVector::operator[](&this->b,uVar10);
      dVar1 = ABS((double)local_48._0_8_ - *pdVar4);
      if (1e-05 < dVar1) {
        dVar13 = ABS(*pdVar4);
        dVar14 = ABS((double)local_48._0_8_);
        if (ABS((double)local_48._0_8_) <= dVar13) {
          dVar14 = dVar13;
        }
        if (dVar14 * 0.0001 < dVar1) {
          local_58.out = (ostream *)&std::cerr;
          local_58.print = false;
          pDVar5 = Debug::operator<<(&local_58,"Row ");
          pDVar5 = Debug::operator<<(pDVar5,uVar10);
          pDVar5 = Debug::operator<<(pDVar5," failed equality test (");
          pDVar5 = Debug::operator<<(pDVar5,"should be: ");
          pdVar4 = DVector::operator[](&this->b,uVar10);
          pDVar5 = Debug::operator<<(pDVar5,*pdVar4);
          pDVar5 = Debug::operator<<(pDVar5,", is ");
          pDVar5 = Debug::operator<<(pDVar5,(double)local_48._0_8_);
          Debug::operator<<(pDVar5,")\n");
          bVar8 = false;
        }
      }
    }
    return bVar8;
  }
  __assert_fail("x.dimension() == cols.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                0x98,"bool fizplex::LP::is_feasible(const DVector &) const");
}

Assistant:

bool LP::is_feasible(const DVector &x) const {
  assert(x.dimension() == cols.size());
  bool feasible = true;
  for (size_t i = 0; i < cols.size(); i++) {
    if (is_finite(cols[i].lower) && is_lower_norm(x[i], cols[i].lower)) {
      Debug(0) << "Var " << i << " is below lower bound: " << x[i] << " < "
               << cols[i].lower << "\n";
      feasible = false;
    }
    if (is_finite(cols[i].upper) && is_greater_norm(x[i], cols[i].upper)) {
      Debug(0) << "Var " << i << " is above upper bound: " << x[i] << " > "
               << cols[i].upper << "\n";
      feasible = false;
    }
  }
  for (size_t row = 0; row < row_count(); row++) {
    double val = 0.0;
    for (size_t col = 0; col < column_count(); col++)
      val += A.get_value(row, col) * x[col];
    if (!is_eq_norm(val, b[row], 1e-4, 1e-5)) {
      Debug(0) << "Row " << row << " failed equality test ("
               << "should be: " << b[row] << ", is " << val << ")\n";
      feasible = false;
    }
  }
  return feasible;
}